

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O2

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  pointer pTVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Factor *pFVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t *psVar7;
  long lVar8;
  size_t beta;
  TProb<double> *this_00;
  ulong beta_00;
  undefined1 in_XMM2 [16];
  
  for (this_00 = &((this->_Qa).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_p;
      (pointer)((long)(this_00 + -2) + 0x10) !=
      (this->_Qa).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish; this_00 = (TProb<double> *)((long)(this_00 + 2) + 8)) {
    bVar3 = VarSet::operator&&((VarSet *)((long)(this_00 + -2) + 0x10),(VarSet *)ctx);
    if (bVar3) {
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,(long)(this_00->_p).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          *(long *)&(this_00->_p).
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl >> 3);
      TProb<double>::fill(this_00,1.0 / auVar2._0_8_);
    }
  }
  beta_00 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (*(long *)(CONCAT44(extraout_var,iVar4) + 0x100) -
            *(long *)(CONCAT44(extraout_var,iVar4) + 0xf8)) / 0x28;
    if (uVar5 <= beta_00) break;
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    lVar8 = beta_00 * 0x28;
    bVar3 = VarSet::operator&&((VarSet *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0xf8) + lVar8)
                               ,(VarSet *)ctx);
    if (bVar3) {
      pTVar1 = (this->_Qb).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,*(undefined8 *)
                                           (*(long *)(CONCAT44(extraout_var_01,iVar4) + 0xf8) + 0x18
                                           + lVar8));
      TProb<double>::fill(&pTVar1[beta_00]._p,1.0 / auVar2._0_8_);
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      psVar7 = *(size_t **)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x158) + beta_00 * 0x18);
      while( true ) {
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        if (psVar7 == *(size_t **)
                       (*(long *)(CONCAT44(extraout_var_03,iVar4) + 0x158) + 8 + beta_00 * 0x18))
        break;
        pFVar6 = muab(this,*psVar7,beta_00);
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        auVar2 = vcvtusi2sd_avx512f(in_XMM2,*(undefined8 *)
                                             (*(long *)(CONCAT44(extraout_var_04,iVar4) + 0xf8) +
                                              0x18 + lVar8));
        TProb<double>::fill(&pFVar6->_p,1.0 / auVar2._0_8_);
        pFVar6 = muba(this,beta_00,*psVar7);
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        auVar2 = vcvtusi2sd_avx512f(in_XMM2,*(undefined8 *)
                                             (*(long *)(CONCAT44(extraout_var_05,iVar4) + 0xf8) +
                                              0x18 + lVar8));
        TProb<double>::fill(&pFVar6->_p,1.0 / auVar2._0_8_);
        psVar7 = psVar7 + 1;
      }
    }
    beta_00 = beta_00 + 1;
  }
  return (int)uVar5;
}

Assistant:

void HAK::init( const VarSet &ns ) {
        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            if( alpha->vars() && ns )
                alpha->fill( 1.0 / alpha->stateSpace() );

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            if( grm().IR(beta) && ns ) {
                _Qb[beta].fill( 1.0 / grm().IR(beta).stateSpace() );
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta).fill( 1.0 / grm().IR(beta).stateSpace() );
                    muba(beta,*alpha).fill( 1.0 / grm().IR(beta).stateSpace() );
                }
            }
    }